

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O2

void anon_unknown.dwarf_388b1::not_equals1(void)

{
  int local_a0 [2];
  string expected;
  string msg;
  
  msg._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  msg._M_string_length._0_4_ = 0x72;
  local_a0[0] = 1;
  expected._M_dataplus._M_p._0_4_ = 1;
  UnitTests::Assert::NotEquals<int,int>((Assert *)&msg,(int *)&expected,local_a0);
  expected._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  expected._M_string_length._0_4_ = 0x73;
  std::__cxx11::string::string
            ((string *)&msg,"ASSERT_NOT_EQUALS should have fired here.",(allocator *)local_a0);
  UnitTests::Assert::Fail((Assert *)&expected,&msg);
}

Assistant:

TEST(assert_true1)
    {
        try
        {
            ASSERT_TRUE(1 == 2);
            FAIL("ASSERT_TRUE should have fired here.");
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg      = e.what();
            std::string expected = "error A1000: Assertion failure :  Expression evaluated to false";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_TRUE", __FILE__, __LINE__);
            }
        }
    }